

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O1

BucketType * __thiscall
Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)256>(HeapInfo *this,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *in_FS_OFFSET;
  
  if ((sizeCat == 0) || (0x300 < sizeCat || (sizeCat & 0xf) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0xc4,"(IsAlignedSmallObjectSize(sizeCat))",
                       "IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
  }
  return &this->heapBuckets[(int)(sizeCat >> 4) - 1].smallNormalWithBarrierHeapBucket;
}

Assistant:

typename SmallHeapBlockType<attributes, SmallAllocationBlockAttributes>::BucketType&
HeapInfo::GetBucket(size_t sizeCat)
{
    uint bucket = HeapInfo::GetBucketIndex(sizeCat);
    return this->heapBuckets[bucket].GetBucket<attributes>();
}